

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::Configurations::hasConfiguration(Configurations *this,ConfigurationType configurationType)

{
  bool result;
  EnumType lIndex;
  _Any_data *fn;
  EnumType *startIndex;
  anon_class_32_4_1fe0db86 *in_stack_ffffffffffffff98;
  function<bool_()> *in_stack_ffffffffffffffa0;
  EnumType local_38 [9];
  byte local_11;
  _Any_data local_10;
  
  local_10._0_4_ = 2;
  local_11 = 0;
  fn = &local_10;
  startIndex = local_38;
  std::function<bool()>::
  function<el::Configurations::hasConfiguration(el::ConfigurationType)::__0,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  LevelHelper::forEachLevel(startIndex,(function<bool_()> *)fn);
  el::base::utils::std::function<bool_()>::~function((function<bool_()> *)0x225044);
  return (bool)(local_11 & 1);
}

Assistant:

bool Configurations::hasConfiguration(ConfigurationType configurationType) {
  base::type::EnumType lIndex = LevelHelper::kMinValid;
  bool result = false;
  LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
    if (hasConfiguration(LevelHelper::castFromInt(lIndex), configurationType)) {
      result = true;
    }
    return result;
  });
  return result;
}